

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          Descriptor *desc)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  bool bVar7;
  string local_38;
  
  uVar3 = (ulong)*(int *)((long)&(options->namespace_prefix)._M_string_length + 4);
  bVar7 = 0 < (long)uVar3;
  if (0 < (long)uVar3) {
    desc = (Descriptor *)(options->namespace_prefix).field_2._M_allocated_capacity;
    bVar7 = true;
    if (*(long *)(desc + 0x60) == 0) {
      desc = desc + 0x108;
      uVar2 = 1;
      do {
        uVar6 = uVar2;
        if (uVar3 == uVar6) break;
        lVar1 = *(long *)desc;
        desc = desc + 0xa8;
        uVar2 = uVar6 + 1;
      } while (lVar1 == 0);
      bVar7 = uVar6 < uVar3;
    }
  }
  if (bVar7) {
    GetMessagePath_abi_cxx11_(&local_38,this,options,desc);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar1 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
  }
  if ((bVar7) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2)) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string OneofFieldsArrayName(const GeneratorOptions& options,
                            const Descriptor* desc) {
  return HasOneofFields(desc)
             ? (GetMessagePath(options, desc) + kOneofGroupArrayName)
             : "null";
}